

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doubling-factor-counter.cpp
# Opt level: O0

DoublingFactorReport * __thiscall
mahjong::DoubligFactorCounter::report
          (DoublingFactorReport *__return_storage_ptr__,DoubligFactorCounter *this)

{
  int iVar1;
  undefined1 local_120 [8];
  DoublingFactorTable t;
  undefined1 local_d0 [8];
  PatternComputer c;
  DoubligFactorCounter *this_local;
  DoublingFactorReport *r;
  
  c.highest_wining_hand._79_1_ = 0;
  DoublingFactorReport::DoublingFactorReport(__return_storage_ptr__);
  PatternComputer::PatternComputer((PatternComputer *)local_d0,this->hand,this->state);
  PatternComputer::compute
            ((PatternComputer *)local_d0,&__return_storage_ptr__->patterns,
             &__return_storage_ptr__->wining_hand);
  iVar1 = PlayerHand::bonusTileCount(this->hand,this->state);
  __return_storage_ptr__->bonus_tile_count = iVar1;
  DoublingFactorTable::DoublingFactorTable((DoublingFactorTable *)local_120,this->hand,this->state);
  iVar1 = DoublingFactorTable::total
                    ((DoublingFactorTable *)local_120,&__return_storage_ptr__->patterns);
  __return_storage_ptr__->doubling_factor = iVar1;
  __return_storage_ptr__->doubling_factor =
       __return_storage_ptr__->bonus_tile_count + __return_storage_ptr__->doubling_factor;
  c.highest_wining_hand._79_1_ = 1;
  DoublingFactorTable::~DoublingFactorTable((DoublingFactorTable *)local_120);
  PatternComputer::~PatternComputer((PatternComputer *)local_d0);
  if ((c.highest_wining_hand._79_1_ & 1) == 0) {
    DoublingFactorReport::~DoublingFactorReport(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

DoublingFactorReport DoubligFactorCounter::report()
{
	DoublingFactorReport r;

	PatternComputer c(hand, state);
	c.compute(r.patterns, r.wining_hand);

	r.bonus_tile_count = hand.bonusTileCount(state);

	DoublingFactorTable t(hand, state);
	r.doubling_factor = t.total(r.patterns);
	r.doubling_factor += r.bonus_tile_count;

	return r;
}